

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O0

bool __thiscall
Rml::Context::ProcessMouseWheel(Context *this,Vector2f wheel_delta,int key_modifier_state)

{
  Vector2<float> delta_distance;
  bool bVar1;
  Mode MVar2;
  pointer pSVar3;
  type pVVar4;
  Element *in_target;
  Element *pEVar5;
  Element *target;
  Vector2f scroll_length;
  float unit_scroll_length;
  undefined1 local_40 [8];
  Dictionary scroll_parameters;
  int key_modifier_state_local;
  Context *this_local;
  float fStack_10;
  Vector2f wheel_delta_local;
  
  scroll_parameters.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = key_modifier_state;
  unique0x1000032b = wheel_delta;
  pSVar3 = ::std::unique_ptr<Rml::ScrollController,_std::default_delete<Rml::ScrollController>_>::
           operator->(&this->scroll_controller);
  MVar2 = ScrollController::GetMode(pSVar3);
  if (MVar2 == Autoscroll) {
    pSVar3 = ::std::unique_ptr<Rml::ScrollController,_std::default_delete<Rml::ScrollController>_>::
             operator->(&this->scroll_controller);
    ScrollController::Reset(pSVar3);
    wheel_delta_local.x._3_1_ = 0;
    goto LAB_004cbe45;
  }
  if (this->hover == (Element *)0x0) {
    pSVar3 = ::std::unique_ptr<Rml::ScrollController,_std::default_delete<Rml::ScrollController>_>::
             operator->(&this->scroll_controller);
    ScrollController::Reset(pSVar3);
    wheel_delta_local.x._3_1_ = 1;
    goto LAB_004cbe45;
  }
  itlib::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  ::flat_map((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
              *)local_40);
  GenerateMouseEventParameters
            (this,(flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
                   *)local_40,-1);
  GenerateKeyModifierEventParameters
            (this,(Dictionary *)local_40,
             scroll_parameters.m_container.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  pVVar4 = itlib::
           flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
           ::operator[]<char_const(&)[14]>
                     ((flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                       *)local_40,(char (*) [14])"wheel_delta_x");
  Variant::operator=(pVVar4,(float *)((long)&this_local + 4));
  pVVar4 = itlib::
           flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
           ::operator[]<char_const(&)[14]>
                     ((flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                       *)local_40,(char (*) [14])"wheel_delta_y");
  Variant::operator=(pVVar4,&fStack_10);
  bVar1 = Element::DispatchEvent(this->hover,Mousescroll,(Dictionary *)local_40);
  if (bVar1) {
    delta_distance =
         Vector2<float>::operator*
                   ((Vector2<float> *)((long)&this_local + 4),
                    this->density_independent_pixel_ratio * 80.0);
    in_target = Element::GetClosestScrollableContainer(this->hover);
    pSVar3 = ::std::unique_ptr<Rml::ScrollController,_std::default_delete<Rml::ScrollController>_>::
             operator->(&this->scroll_controller);
    MVar2 = ScrollController::GetMode(pSVar3);
    if (MVar2 == Smoothscroll) {
      pSVar3 = ::std::unique_ptr<Rml::ScrollController,_std::default_delete<Rml::ScrollController>_>
               ::operator->(&this->scroll_controller);
      pEVar5 = ScrollController::GetTarget(pSVar3);
      if (pEVar5 != in_target) goto LAB_004cbdf9;
      pSVar3 = ::std::unique_ptr<Rml::ScrollController,_std::default_delete<Rml::ScrollController>_>
               ::operator->(&this->scroll_controller);
      ScrollController::IncrementSmoothscrollTarget(pSVar3,delta_distance);
    }
    else {
LAB_004cbdf9:
      pSVar3 = ::std::unique_ptr<Rml::ScrollController,_std::default_delete<Rml::ScrollController>_>
               ::operator->(&this->scroll_controller);
      ScrollController::ActivateSmoothscroll(pSVar3,in_target,delta_distance,Auto);
    }
    wheel_delta_local.x._3_1_ = in_target == (Element *)0x0;
  }
  else {
    wheel_delta_local.x._3_1_ = false;
  }
  itlib::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  ::~flat_map((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
               *)local_40);
LAB_004cbe45:
  return (bool)(wheel_delta_local.x._3_1_ & 1);
}

Assistant:

bool Context::ProcessMouseWheel(Vector2f wheel_delta, int key_modifier_state)
{
	if (scroll_controller->GetMode() == ScrollController::Mode::Autoscroll)
	{
		scroll_controller->Reset();
		return false;
	}
	else if (!hover)
	{
		scroll_controller->Reset();
		return true;
	}

	Dictionary scroll_parameters;
	GenerateMouseEventParameters(scroll_parameters);
	GenerateKeyModifierEventParameters(scroll_parameters, key_modifier_state);
	scroll_parameters["wheel_delta_x"] = wheel_delta.x;
	scroll_parameters["wheel_delta_y"] = wheel_delta.y;

	// Dispatch a mouse scroll event, this gives elements an opportunity to block scrolling from being performed.
	if (!hover->DispatchEvent(EventId::Mousescroll, scroll_parameters))
		return false;

	const float unit_scroll_length = UNIT_SCROLL_LENGTH * density_independent_pixel_ratio;
	const Vector2f scroll_length = wheel_delta * unit_scroll_length;
	Element* target = hover->GetClosestScrollableContainer();

	if (scroll_controller->GetMode() == ScrollController::Mode::Smoothscroll && scroll_controller->GetTarget() == target)
		scroll_controller->IncrementSmoothscrollTarget(scroll_length);
	else
		scroll_controller->ActivateSmoothscroll(target, scroll_length, ScrollBehavior::Auto);

	return target == nullptr;
}